

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::propagate_scope_variable(Generator *top)

{
  undefined1 local_58 [8];
  PropagateScopeVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  PropagateScopeVisitor::PropagateScopeVisitor((PropagateScopeVisitor *)local_58);
  IRVisitor::visit_root
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  PropagateScopeVisitor::~PropagateScopeVisitor((PropagateScopeVisitor *)local_58);
  return;
}

Assistant:

void propagate_scope_variable(Generator *top) {
    PropagateScopeVisitor visitor;
    visitor.visit_root(top);
}